

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void start_rx_queue(ixgbe_device *dev,int queue_id)

{
  int reg;
  long *plVar1;
  mempool *pmVar2;
  long *plVar3;
  pkt_buf *ppVar4;
  uint in_ESI;
  long in_RDI;
  pkt_buf *buf;
  ixgbe_adv_rx_desc *rxd;
  int i;
  int mempool_size;
  ixgbe_rx_queue *queue;
  int local_74;
  mempool *in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint8_t *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  int local_20;
  
  fprintf(_stderr,"[DEBUG] %s:%d %s(): starting rx queue %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x116,"start_rx_queue",(ulong)in_ESI);
  plVar1 = (long *)(*(long *)(in_RDI + 0x78) + (long)(int)in_ESI * 0x18);
  pmVar2 = memory_allocate_mempool
                     ((uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (uint32_t)in_stack_ffffffffffffffb0);
  plVar1[1] = (long)pmVar2;
  if ((*(ushort *)(plVar1 + 2) & (short)plVar1[2] - 1U) != 0) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x121,"start_rx_queue");
    abort();
  }
  local_20 = 0;
  while( true ) {
    if ((int)(uint)*(ushort *)(plVar1 + 2) <= local_20) {
      set_flags32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      wait_set_reg32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      if ((int)in_ESI < 0x40) {
        reg = in_ESI * 0x40 + 0x1010;
      }
      else {
        reg = (in_ESI - 0x40) * 0x40 + 0xd010;
      }
      set_reg32(*(uint8_t **)(in_RDI + 0x70),reg,0);
      if ((int)in_ESI < 0x40) {
        local_74 = in_ESI * 0x40 + 0x1018;
      }
      else {
        local_74 = (in_ESI - 0x40) * 0x40 + 0xd018;
      }
      set_reg32(*(uint8_t **)(in_RDI + 0x70),local_74,*(ushort *)(plVar1 + 2) - 1);
      return;
    }
    plVar3 = (long *)(*plVar1 + (long)local_20 * 0x10);
    ppVar4 = pkt_buf_alloc(in_stack_ffffffffffffff90);
    if (ppVar4 == (pkt_buf *)0x0) break;
    *plVar3 = ppVar4->buf_addr_phy + 0x40;
    plVar3[1] = 0;
    plVar1[(long)local_20 + 3] = (long)ppVar4;
    local_20 = local_20 + 1;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): failed to allocate rx descriptor\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x127,"start_rx_queue");
  abort();
}

Assistant:

static void start_rx_queue(struct ixgbe_device* dev, int queue_id) {
	debug("starting rx queue %d", queue_id);
	struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*)(dev->rx_queues)) + queue_id;
	// 2048 as pktbuf size is strictly speaking incorrect:
	// we need a few headers (1 cacheline), so there's only 1984 bytes left for the device
	// but the 82599 can only handle sizes in increments of 1 kb; but this is fine since our max packet size
	// is the default MTU of 1518
	// this has to be fixed if jumbo frames are to be supported
	// mempool should be >= the number of rx and tx descriptors for a forwarding application
	int mempool_size = NUM_RX_QUEUE_ENTRIES + NUM_TX_QUEUE_ENTRIES;
	queue->mempool = memory_allocate_mempool(mempool_size < MIN_MEMPOOL_ENTRIES ? MIN_MEMPOOL_ENTRIES : mempool_size, PKT_BUF_ENTRY_SIZE);
	if (queue->num_entries & (queue->num_entries - 1)) {
		error("number of queue entries must be a power of 2");
	}
	for (int i = 0; i < queue->num_entries; i++) {
		volatile union ixgbe_adv_rx_desc* rxd = queue->descriptors + i;
		struct pkt_buf* buf = pkt_buf_alloc(queue->mempool);
		if (!buf) {
			error("failed to allocate rx descriptor");
		}
		rxd->read.pkt_addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
		rxd->read.hdr_addr = 0;
		// we need to return the virtual address in the rx function which the descriptor doesn't know by default
		queue->virtual_addresses[i] = buf;
	}
	// enable queue and wait if necessary
	set_flags32(dev->addr, IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
	wait_set_reg32(dev->addr, IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
	// rx queue starts out full
	set_reg32(dev->addr, IXGBE_RDH(queue_id), 0);
	// was set to 0 before in the init function
	set_reg32(dev->addr, IXGBE_RDT(queue_id), queue->num_entries - 1);
}